

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_baseline_tree_index_impl.h
# Opt level: O0

double __thiscall
ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
ted_k(TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
      *this,TreeIndexAll *t1,TreeIndexAll *t2,int k)

{
  uint uVar1;
  int iVar2;
  TreeIndexAll *pTVar3;
  TreeIndexAll *pTVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  int *piVar9;
  double *pdVar10;
  double extraout_XMM0_Qa;
  int local_4c;
  int local_48;
  int local_44 [3];
  uint local_38;
  int y;
  int x;
  int t2_size;
  int t1_size;
  int k_local;
  TreeIndexAll *t2_local;
  TreeIndexAll *t1_local;
  TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  *this_local;
  
  x = (t1->super_Constants).tree_size_;
  y = (t2->super_Constants).tree_size_;
  t2_size = k;
  _t1_size = t2;
  t2_local = t1;
  t1_local = (TreeIndexAll *)this;
  TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
  init_matrices(&this->
                 super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ,x,k);
  (this->
  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>).
  super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
  subproblem_counter_ = 0;
  iVar6 = x - y;
  if (iVar6 < 1) {
    iVar6 = -iVar6;
  }
  if (t2_size < iVar6) {
    this_local = (TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  *)std::numeric_limits<double>::infinity();
  }
  else {
    for (local_38 = 0; (int)local_38 < x; local_38 = local_38 + 1) {
      local_44[1] = 0;
      local_44[0] = local_38 - t2_size;
      puVar8 = (uint *)std::max<int>(local_44 + 1,local_44);
      local_44[2] = *puVar8;
      while( true ) {
        iVar6 = local_44[2];
        local_48 = local_38 + t2_size;
        local_4c = y + -1;
        piVar9 = std::min<int>(&local_48,&local_4c);
        if (*piVar9 < iVar6) break;
        bVar5 = TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ::k_relevant(&this->
                              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ,t2_local,_t1_size,local_38,local_44[2],t2_size);
        pTVar4 = t2_local;
        pTVar3 = _t1_size;
        iVar2 = t2_size;
        uVar1 = local_38;
        iVar6 = local_44[2];
        if (bVar5) {
          iVar7 = TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  ::e_budget(&this->
                              super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             ,t2_local,_t1_size,local_38,local_44[2],t2_size);
          (*(this->
            super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
            ).
            super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
            _vptr_TEDAlgorithm[2])
                    (this,pTVar4,pTVar3,(ulong)uVar1,(ulong)(uint)iVar6,(ulong)(uint)iVar2,iVar7);
          pdVar10 = data_structures::BandMatrix<double>::at
                              (&(this->
                                super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                ).td_,(long)(int)local_38,(long)local_44[2]);
          *pdVar10 = extraout_XMM0_Qa;
        }
        local_44[2] = local_44[2] + 1;
      }
    }
    pdVar10 = data_structures::BandMatrix<double>::at
                        (&(this->
                          super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          ).td_,(long)((t2_local->super_Constants).tree_size_ + -1),
                         (long)((_t1_size->super_Constants).tree_size_ + -1));
    this_local = (TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                  *)*pdVar10;
  }
  return (double)this_local;
}

Assistant:

double TouzetBaselineTreeIndex<CostModel, TreeIndex>::ted_k(const TreeIndex& t1,
    const TreeIndex& t2, const int k) {
  
  const int t1_size = t1.tree_size_;
  const int t2_size = t2.tree_size_;

  init_matrices(t1_size, k);
  
  // Reset subproblem counter.
  subproblem_counter_ = 0;

  // If the pair of root nodes is not in k-strip (input tree size difference is
  // greater than k), return infinity.
  if (std::abs(t1_size - t2_size) > k) {
    return std::numeric_limits<double>::infinity();
  }
  
  // Nested loop over all node pairs in k-strip : |x-y|<=k. This loop iterates
  // over all node pairs from k-strip, and verifies their k-relevancy.
  for (int x = 0; x < t1_size; ++x) {
    for (int y = std::max(0, x - k); y <= std::min(x + k, t2_size-1); ++y) {
      if (k_relevant(t1, t2, x, y, k)) {
        // Compute td(x, y) with e errors - the value of e(x, y, k).
        td_.at(x, y) = tree_dist(t1, t2, x, y, k, e_budget(t1, t2, x, y, k));
      }
    }
  }
  
  return td_.at(t1.tree_size_-1, t2.tree_size_-1);
}